

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  sqlite3 *db;
  char *zDb;
  char *pKey;
  int iVar4;
  uint uVar5;
  HashElem *pHVar6;
  long lVar7;
  uint uVar8;
  Trigger *pTrigger;
  bool bVar9;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (iVar4 = sqlite3ReadSchema(pParse), iVar4 == 0)) {
    zDb = pName->a[0].zDatabase;
    uVar3 = db->nDb;
    uVar8 = 0;
    if (0 < (int)uVar3) {
      pKey = pName->a[0].zName;
      pTrigger = (Trigger *)0x0;
LAB_00191c99:
      uVar5 = uVar8 < 2 ^ uVar8;
      if (zDb != (char *)0x0) {
        lVar7 = 0;
        do {
          bVar1 = db->aDb[uVar5].zDbSName[lVar7];
          bVar2 = zDb[lVar7];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_00191cdf;
          }
          else if (""[bVar1] != ""[bVar2]) goto LAB_00191cdf;
          lVar7 = lVar7 + 1;
        } while( true );
      }
      goto LAB_00191ce4;
    }
    pTrigger = (Trigger *)0x0;
LAB_00191d1b:
    if (pTrigger == (Trigger *)0x0) {
      if (noErr == 0) {
        sqlite3ErrorMsg(pParse,"no such trigger: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,zDb);
      }
      pParse->checkSchema = '\x01';
    }
    else {
      sqlite3DropTriggerPtr(pParse,pTrigger);
    }
  }
  sqlite3SrcListDelete(db,pName);
  return;
LAB_00191cdf:
  if (bVar1 == bVar2) {
LAB_00191ce4:
    pHVar6 = findElementWithHash(&(db->aDb[uVar5].pSchema)->trigHash,pKey,(uint *)0x0);
    pTrigger = (Trigger *)pHVar6->data;
    bVar9 = pTrigger != (Trigger *)0x0;
  }
  else {
    bVar9 = false;
  }
  if ((bVar9) || (uVar8 = uVar8 + 1, uVar8 == uVar3)) goto LAB_00191d1b;
  goto LAB_00191c99;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  zDb = pName->a[0].zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3StrICmp(db->aDb[j].zDbSName, zDb) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}